

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O1

timestamp_t duckdb::Timestamp::FromEpochMsPossiblyInfinite(int64_t ms)

{
  bool bVar1;
  ConversionException *this;
  int64_t result;
  int64_t local_48;
  string local_40;
  
  bVar1 = TryMultiplyOperator::Operation<long,long,long>(ms,1000,&local_48);
  if (bVar1) {
    return (timestamp_t)local_48;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Could not convert Timestamp(MS) to Timestamp(US)","");
  ConversionException::ConversionException(this,&local_40);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

timestamp_t Timestamp::FromEpochMsPossiblyInfinite(int64_t ms) {
	int64_t result;
	if (!TryMultiplyOperator::Operation(ms, Interval::MICROS_PER_MSEC, result)) {
		throw ConversionException("Could not convert Timestamp(MS) to Timestamp(US)");
	}
	return timestamp_t(result);
}